

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamMultiReader_p.cpp
# Opt level: O3

bool __thiscall
BamTools::Internal::BamMultiReaderPrivate::UpdateAlignmentCache(BamMultiReaderPrivate *this)

{
  pointer pMVar1;
  BamReader *this_00;
  BamAlignment *alignment;
  bool bVar2;
  IMultiMerger *pIVar3;
  MergeItem *item;
  pointer pMVar4;
  string local_70;
  string local_50;
  
  pIVar3 = this->m_alignmentCache;
  if (pIVar3 == (IMultiMerger *)0x0) {
    pIVar3 = CreateAlignmentCache(this);
    this->m_alignmentCache = pIVar3;
    if (pIVar3 == (IMultiMerger *)0x0) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,"BamMultiReader::UpdateAlignmentCache","");
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"unable to create new alignment cache","");
      SetErrorString(this,&local_70,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      return false;
    }
  }
  (*pIVar3->_vptr_IMultiMerger[3])();
  pMVar4 = (this->m_readers).
           super__Vector_base<BamTools::Internal::MergeItem,_std::allocator<BamTools::Internal::MergeItem>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pMVar1 = (this->m_readers).
           super__Vector_base<BamTools::Internal::MergeItem,_std::allocator<BamTools::Internal::MergeItem>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pMVar4 != pMVar1) {
    do {
      this_00 = pMVar4->Reader;
      alignment = pMVar4->Alignment;
      if ((alignment != (BamAlignment *)0x0 && this_00 != (BamReader *)0x0) &&
         (bVar2 = BamReader::GetNextAlignmentCore(this_00,alignment), bVar2)) {
        local_70._M_dataplus._M_p = (pointer)this_00;
        local_70._M_string_length = (size_type)alignment;
        (*this->m_alignmentCache->_vptr_IMultiMerger[2])(this->m_alignmentCache,&local_70);
      }
      pMVar4 = pMVar4 + 1;
    } while (pMVar4 != pMVar1);
  }
  return true;
}

Assistant:

bool BamMultiReaderPrivate::UpdateAlignmentCache()
{

    // create alignment cache if not created yet
    if (m_alignmentCache == 0) {
        m_alignmentCache = CreateAlignmentCache();
        if (m_alignmentCache == 0) {
            SetErrorString("BamMultiReader::UpdateAlignmentCache",
                           "unable to create new alignment cache");
            return false;
        }
    }

    // clear any prior cache data
    m_alignmentCache->Clear();

    // iterate over readers
    std::vector<MergeItem>::iterator readerIter = m_readers.begin();
    std::vector<MergeItem>::iterator readerEnd = m_readers.end();
    for (; readerIter != readerEnd; ++readerIter) {
        MergeItem& item = (*readerIter);
        BamReader* reader = item.Reader;
        BamAlignment* alignment = item.Alignment;
        if (reader == 0 || alignment == 0) continue;

        // save next alignment from each reader in cache
        SaveNextAlignment(reader, alignment);
    }

    // if we get here, ok
    return true;
}